

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void deqp::gls::BuiltinPrecisionTests::
     ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doPrintIVal
               (FloatFormat *fmt,IVal *ival,ostream *os)

{
  Vector<tcu::Interval,_2> *pVVar1;
  double *pdVar2;
  long lVar3;
  int ndx;
  long lVar4;
  undefined1 auStack_78 [8];
  undefined8 uStack_70;
  IVal local_68;
  
  uStack_70 = 0x731eab;
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  lVar4 = 0;
  do {
    if (lVar4 != 0) {
      uStack_70 = 0x731eda;
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    }
    lVar3 = 0x10;
    do {
      auStack_78[lVar3] = 0;
      *(undefined8 *)((long)&uStack_70 + lVar3) = 0x7ff0000000000000;
      *(undefined8 *)(&local_68.m_data[0].m_hasNaN + lVar3) = 0xfff0000000000000;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x40);
    pVVar1 = (ival->m_data).m_data + lVar4;
    local_68.m_data[0].m_hasNaN = pVVar1->m_data[0].m_hasNaN;
    local_68.m_data[0]._1_7_ = *(undefined7 *)&pVVar1->m_data[0].field_0x1;
    local_68.m_data[0].m_lo = pVVar1->m_data[0].m_lo;
    pdVar2 = &(ival->m_data).m_data[lVar4].m_data[0].m_hi;
    local_68.m_data[0].m_hi = *pdVar2;
    local_68.m_data[1]._0_8_ = pdVar2[1];
    pdVar2 = &(ival->m_data).m_data[lVar4].m_data[1].m_lo;
    local_68.m_data[1].m_lo = *pdVar2;
    local_68.m_data[1].m_hi = pdVar2[1];
    uStack_70 = 0x731f33;
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doPrintIVal
              (fmt,&local_68,os);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  uStack_70 = 0x731f50;
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

static void			doPrintIVal		(const FloatFormat& fmt, const IVal ival, ostream& os)
	{
		os << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printIVal<Element>(fmt, ival[ndx], os);
		}

		os << ")";
	}